

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_union_add_field(parser_info *info)

{
  int iVar1;
  int iVar2;
  
  coda_type_record_field_set_optional((coda_type_record_field *)info->node->data);
  iVar1 = coda_type_record_add_field
                    ((coda_type_record *)info->node->parent->data,
                     (coda_type_record_field *)info->node->data);
  iVar2 = -1;
  if (iVar1 == 0) {
    info->node->data = (void *)0x0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int cd_union_add_field(parser_info *info)
{
    /* force union fields to be optional */
    coda_type_record_field_set_optional((coda_type_record_field *)info->node->data);
    if (coda_type_record_add_field((coda_type_record *)info->node->parent->data,
                                   (coda_type_record_field *)info->node->data) != 0)
    {
        return -1;
    }
    info->node->data = NULL;
    return 0;
}